

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsTestDriver.cpp
# Opt level: O0

void __thiscall xs::TestDriver::TestDriver(TestDriver *this,TestProcess *testProcess)

{
  allocator<unsigned_char> local_19;
  TestProcess *local_18;
  TestProcess *testProcess_local;
  TestDriver *this_local;
  
  this->m_state = STATE_NOT_STARTED;
  local_18 = testProcess;
  testProcess_local = (TestProcess *)this;
  std::__cxx11::string::string((string *)&this->m_lastLaunchFailure);
  this->m_lastExitCode = 0;
  this->m_process = local_18;
  this->m_lastProcessDataTime = 0;
  std::allocator<unsigned_char>::allocator(&local_19);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->m_dataMsgTmpBuf,0x1000,&local_19);
  std::allocator<unsigned_char>::~allocator(&local_19);
  return;
}

Assistant:

TestDriver::TestDriver (xs::TestProcess* testProcess)
	: m_state				(STATE_NOT_STARTED)
	, m_lastExitCode		(0)
	, m_process				(testProcess)
	, m_lastProcessDataTime	(0)
	, m_dataMsgTmpBuf		(SEND_RECV_TMP_BUFFER_SIZE)
{
}